

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.cpp
# Opt level: O3

int mbedtls_mpi_add_abs(mbedtls_mpi *X,mbedtls_mpi *A,mbedtls_mpi *B)

{
  mbedtls_mpi_uint *X_00;
  int iVar1;
  mbedtls_mpi_uint mVar2;
  ulong *puVar3;
  long lVar4;
  size_t nblimbs;
  bool bVar5;
  
  bVar5 = X == B;
  if (bVar5) {
    B = A;
  }
  if ((A != X && !bVar5) && (iVar1 = mbedtls_mpi_copy(X,A), iVar1 != 0)) {
    return iVar1;
  }
  X->s = 1;
  nblimbs = (size_t)B->n;
  if (nblimbs == 0) {
    return 0;
  }
  lVar4 = -(ulong)((uint)B->n * 8);
  while (B->p[nblimbs - 1] == 0) {
    lVar4 = lVar4 + 8;
    nblimbs = nblimbs - 1;
    if (nblimbs == 0) {
      return 0;
    }
  }
  iVar1 = mbedtls_mpi_grow(X,nblimbs);
  if (iVar1 != 0) {
    return iVar1;
  }
  X_00 = X->p;
  mVar2 = mbedtls_mpi_core_add(X_00,X_00,B->p,nblimbs);
  if (mVar2 == 0) {
    return 0;
  }
  puVar3 = (ulong *)((long)X_00 - lVar4);
  lVar4 = -lVar4;
  do {
    if (X->n <= nblimbs) {
      iVar1 = mbedtls_mpi_grow(X,nblimbs + 1);
      if (iVar1 != 0) {
        return iVar1;
      }
      puVar3 = (ulong *)((long)X->p + lVar4);
    }
    lVar4 = lVar4 + 8;
    bVar5 = CARRY8(*puVar3,mVar2);
    *puVar3 = *puVar3 + mVar2;
    puVar3 = puVar3 + 1;
    mVar2 = 1;
    nblimbs = nblimbs + 1;
  } while (bVar5);
  return 0;
}

Assistant:

int mbedtls_mpi_add_abs(mbedtls_mpi *X, const mbedtls_mpi *A, const mbedtls_mpi *B)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t j;
    mbedtls_mpi_uint *p;
    mbedtls_mpi_uint c;

    if (X == B) {
        const mbedtls_mpi *T = A; A = X; B = T;
    }

    if (X != A) {
        MBEDTLS_MPI_CHK(mbedtls_mpi_copy(X, A));
    }

    /*
     * X must always be positive as a result of unsigned additions.
     */
    X->s = 1;

    for (j = B->n; j > 0; j--) {
        if (B->p[j - 1] != 0) {
            break;
        }
    }

    /* Exit early to avoid undefined behavior on NULL+0 when X->n == 0
     * and B is 0 (of any size). */
    if (j == 0) {
        return 0;
    }

    MBEDTLS_MPI_CHK(mbedtls_mpi_grow(X, j));

    /* j is the number of non-zero limbs of B. Add those to X. */

    p = X->p;

    c = mbedtls_mpi_core_add(p, p, B->p, j);

    p += j;

    /* Now propagate any carry */

    while (c != 0) {
        if (j >= X->n) {
            MBEDTLS_MPI_CHK(mbedtls_mpi_grow(X, j + 1));
            p = X->p + j;
        }

        *p += c; c = (*p < c); j++; p++;
    }

cleanup:

    return ret;
}